

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_13061b0::HandleScriptMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  string *psVar6;
  cmGlobalGenerator *this;
  pointer pbVar7;
  pointer pbVar8;
  ulong uVar9;
  bool bVar10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  bool all_components;
  bool exclude_from_all;
  string script;
  string component;
  Helper helper;
  undefined1 local_143;
  bool local_142;
  char local_141;
  ulong local_140;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  long local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  size_type local_118;
  pointer local_110;
  cmExecutionStatus *local_108;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_100;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_f8;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  Helper local_80;
  string local_50;
  
  local_108 = status;
  Helper::Helper(&local_80,status);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_80.DefaultComponentName._M_dataplus._M_p,
             local_80.DefaultComponentName._M_dataplus._M_p +
             local_80.DefaultComponentName._M_string_length);
  local_142 = false;
  local_143 = '\0';
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar7 == pbVar8) {
LAB_00386c64:
    if (pbVar8 != pbVar7) {
      local_108 = (cmExecutionStatus *)&local_108->Error;
      local_140 = local_140 & 0xffffffff00000000;
      bVar3 = false;
LAB_00386c86:
      iVar4 = std::__cxx11::string::compare((char *)pbVar8);
      if (iVar4 == 0) {
        bVar3 = true;
LAB_00386e17:
        local_140 = local_140 & 0xffffffff00000000;
      }
      else {
        uVar5 = std::__cxx11::string::compare((char *)pbVar8);
        if ((int)uVar5 == 0) {
          local_140 = CONCAT44(local_140._4_4_,(int)CONCAT71((int7)((ulong)uVar5 >> 8),1));
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)pbVar8);
          pcVar2 = local_80.Makefile;
          if (iVar4 != 0) {
            if (!bVar3) {
              if ((local_140 & 1) != 0) {
                local_f0._M_dataplus._M_p._0_1_ = 1;
                cmMakefile::GetBacktrace(local_80.Makefile);
                std::
                make_unique<cmInstallScriptGenerator,std::__cxx11::string_const&,bool,std::__cxx11::string&,bool&,bool&,cmListFileBacktrace>
                          (&local_b0,(bool *)pbVar8,&local_f0,(bool *)&local_d0,&local_142,
                           (cmListFileBacktrace *)&local_143);
                local_100._M_head_impl = (cmInstallGenerator *)local_b0._M_dataplus._M_p;
                local_b0._M_dataplus._M_p = (pointer)0x0;
                cmMakefile::AddInstallGenerator
                          (pcVar2,(unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                                   *)&local_100);
                if (local_100._M_head_impl != (cmInstallGenerator *)0x0) {
                  (*((local_100._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])
                            ();
                }
                local_100._M_head_impl = (cmInstallGenerator *)0x0;
                if ((long *)local_b0._M_dataplus._M_p != (long *)0x0) {
                  (**(code **)(*(long *)local_b0._M_dataplus._M_p + 8))();
                }
                local_b0._M_dataplus._M_p = (pointer)0x0;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_str !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_str);
                }
                goto LAB_00386e17;
              }
              goto LAB_00386fea;
            }
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            pcVar1 = (pbVar8->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f0,pcVar1,pcVar1 + pbVar8->_M_string_length);
            bVar3 = cmsys::SystemTools::FileIsFullPath(&local_f0);
            if (!bVar3) {
              psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_80.Makefile);
              local_138._M_str = (psVar6->_M_dataplus)._M_p;
              local_138._M_len = psVar6->_M_string_length;
              local_b0._M_dataplus._M_p = (pointer)0x1;
              local_120 = &local_b0.field_2;
              local_b0.field_2._M_local_buf[0] = '/';
              local_128 = 1;
              local_110 = (pbVar8->_M_dataplus)._M_p;
              local_118 = pbVar8->_M_string_length;
              views._M_len = 3;
              views._M_array = &local_138;
              local_b0._M_string_length = (size_type)local_120;
              cmCatViews_abi_cxx11_(&local_50,views);
              std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
                  &local_50.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                         local_50._M_dataplus._M_p._0_1_),
                                local_50.field_2._M_allocated_capacity + 1);
              }
            }
            local_141 = cmsys::SystemTools::FileIsDirectory(&local_f0);
            pcVar2 = local_80.Makefile;
            if ((bool)local_141) {
              local_138._M_len = (size_t)&local_128;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_138,"given a directory as value of SCRIPT argument.","");
              std::__cxx11::string::_M_assign((string *)local_108);
              if ((long *)local_138._M_len != &local_128) {
                operator_delete((void *)local_138._M_len,local_128 + 1);
              }
            }
            else {
              local_50._M_dataplus._M_p._0_1_ = 0;
              cmMakefile::GetBacktrace(local_80.Makefile);
              std::
              make_unique<cmInstallScriptGenerator,std::__cxx11::string&,bool,std::__cxx11::string&,bool&,bool&,cmListFileBacktrace>
                        (&local_b0,(bool *)&local_f0,&local_50,(bool *)&local_d0,&local_142,
                         (cmListFileBacktrace *)&local_143);
              local_f8._M_head_impl = (cmInstallGenerator *)local_b0._M_dataplus._M_p;
              local_b0._M_dataplus._M_p = (pointer)0x0;
              cmMakefile::AddInstallGenerator
                        (pcVar2,(unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                                 *)&local_f8);
              if (local_f8._M_head_impl != (cmInstallGenerator *)0x0) {
                (*((local_f8._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
              }
              local_f8._M_head_impl = (cmInstallGenerator *)0x0;
              if ((long *)local_b0._M_dataplus._M_p != (long *)0x0) {
                (**(code **)(*(long *)local_b0._M_dataplus._M_p + 8))();
              }
              local_b0._M_dataplus._M_p = (pointer)0x0;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_str !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_str);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            bVar3 = false;
            bVar10 = false;
            if (local_141 != '\0') goto LAB_0038709c;
            goto LAB_00386fea;
          }
          local_140 = local_140 & 0xffffffff00000000;
        }
        bVar3 = false;
      }
LAB_00386fea:
      pbVar8 = pbVar8 + 1;
      if (pbVar8 == pbVar7) goto code_r0x00386ff7;
      goto LAB_00386c86;
    }
LAB_0038707c:
    this = cmMakefile::GetGlobalGenerator(local_80.Makefile);
    bVar10 = true;
    cmGlobalGenerator::AddInstallComponent(this,&local_d0);
    goto LAB_0038709c;
  }
  local_140 = 0;
  uVar9 = 0;
  do {
    iVar4 = std::__cxx11::string::compare((char *)(pbVar8 + uVar9));
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((iVar4 == 0) &&
       (uVar9 + 1 <
        (ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5))) {
      std::__cxx11::string::_M_assign((string *)&local_d0);
      local_140 = (ulong)((int)local_140 + 1);
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar9 = uVar9 + 1;
    }
    iVar4 = std::__cxx11::string::compare((char *)(pbVar8 + uVar9));
    if (iVar4 == 0) {
      local_142 = true;
    }
    else {
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar9));
      if (iVar4 == 0) {
        local_143 = '\x01';
      }
    }
    uVar9 = uVar9 + 1;
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar7 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  } while (uVar9 < (ulong)((long)pbVar7 - (long)pbVar8 >> 5));
  if ((int)local_140 < 2) {
    if (((int)local_140 != 1) || (local_143 == '\0')) goto LAB_00386c64;
    local_138._M_len = (size_t)&local_128;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"ALL_COMPONENTS and COMPONENT are mutually exclusive","");
    std::__cxx11::string::_M_assign((string *)&local_108->Error);
  }
  else {
    local_138._M_len = (size_t)&local_128;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,
               "given more than one COMPONENT for the SCRIPT or CODE signature of the INSTALL command. Use multiple INSTALL commands with one COMPONENT each."
               ,"");
    std::__cxx11::string::_M_assign((string *)&local_108->Error);
  }
  if ((long *)local_138._M_len != &local_128) goto LAB_00386c4f;
  goto LAB_00386c5c;
code_r0x00386ff7:
  if (bVar3) {
    local_138._M_len = (size_t)&local_128;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"given no value for SCRIPT argument.","");
    std::__cxx11::string::_M_assign((string *)local_108);
  }
  else {
    if ((local_140 & 1) == 0) goto LAB_0038707c;
    local_138._M_len = (size_t)&local_128;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"given no value for CODE argument.","");
    std::__cxx11::string::_M_assign((string *)local_108);
  }
  if ((long *)local_138._M_len != &local_128) {
LAB_00386c4f:
    operator_delete((void *)local_138._M_len,local_128 + 1);
  }
LAB_00386c5c:
  bVar10 = false;
LAB_0038709c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.DefaultComponentName._M_dataplus._M_p != &local_80.DefaultComponentName.field_2) {
    operator_delete(local_80.DefaultComponentName._M_dataplus._M_p,
                    local_80.DefaultComponentName.field_2._M_allocated_capacity + 1);
  }
  return bVar10;
}

Assistant:

bool HandleScriptMode(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  Helper helper(status);

  std::string component = helper.DefaultComponentName;
  int componentCount = 0;
  bool doing_script = false;
  bool doing_code = false;
  bool exclude_from_all = false;
  bool all_components = false;

  // Scan the args once for COMPONENT. Only allow one.
  //
  for (size_t i = 0; i < args.size(); ++i) {
    if (args[i] == "COMPONENT" && i + 1 < args.size()) {
      ++componentCount;
      ++i;
      component = args[i];
    }
    if (args[i] == "EXCLUDE_FROM_ALL") {
      exclude_from_all = true;
    } else if (args[i] == "ALL_COMPONENTS") {
      all_components = true;
    }
  }

  if (componentCount > 1) {
    status.SetError("given more than one COMPONENT for the SCRIPT or CODE "
                    "signature of the INSTALL command. "
                    "Use multiple INSTALL commands with one COMPONENT each.");
    return false;
  }

  if (all_components && componentCount == 1) {
    status.SetError("ALL_COMPONENTS and COMPONENT are mutually exclusive");
    return false;
  }

  // Scan the args again, this time adding install generators each time we
  // encounter a SCRIPT or CODE arg:
  //
  for (std::string const& arg : args) {
    if (arg == "SCRIPT") {
      doing_script = true;
      doing_code = false;
    } else if (arg == "CODE") {
      doing_script = false;
      doing_code = true;
    } else if (arg == "COMPONENT") {
      doing_script = false;
      doing_code = false;
    } else if (doing_script) {
      doing_script = false;
      std::string script = arg;
      if (!cmSystemTools::FileIsFullPath(script)) {
        script =
          cmStrCat(helper.Makefile->GetCurrentSourceDirectory(), '/', arg);
      }
      if (cmSystemTools::FileIsDirectory(script)) {
        status.SetError("given a directory as value of SCRIPT argument.");
        return false;
      }
      helper.Makefile->AddInstallGenerator(
        cm::make_unique<cmInstallScriptGenerator>(
          script, false, component, exclude_from_all, all_components,
          helper.Makefile->GetBacktrace()));
    } else if (doing_code) {
      doing_code = false;
      std::string const& code = arg;
      helper.Makefile->AddInstallGenerator(
        cm::make_unique<cmInstallScriptGenerator>(
          code, true, component, exclude_from_all, all_components,
          helper.Makefile->GetBacktrace()));
    }
  }

  if (doing_script) {
    status.SetError("given no value for SCRIPT argument.");
    return false;
  }
  if (doing_code) {
    status.SetError("given no value for CODE argument.");
    return false;
  }

  // Tell the global generator about any installation component names
  // specified.
  helper.Makefile->GetGlobalGenerator()->AddInstallComponent(component);

  return true;
}